

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O1

void wirehair::SIMDSafeFree(void *ptr)

{
  if ((ptr != (void *)0x0) && ((ulong)*(byte *)((long)ptr + -1) < 0x20)) {
    free((void *)(((ulong)*(byte *)((long)ptr + -1) - 0x20) + (long)ptr));
    return;
  }
  return;
}

Assistant:

void SIMDSafeFree(void* ptr)
{
    if (!ptr) {
        return;
    }
    uint8_t* data = (uint8_t*)ptr;
    unsigned offset = data[-1];
    if (offset >= GF256_ALIGN_BYTES) {
        CAT_DEBUG_BREAK(); // Should never happen
        return;
    }
    data -= GF256_ALIGN_BYTES - offset;
    free(data);
}